

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardFile.cpp
# Opt level: O0

bool __thiscall Diligent::StandardFile::Read(StandardFile *this,IDataBlob *pData)

{
  bool bVar1;
  Char *Message;
  size_t sVar2;
  void *Data;
  char (*in_RCX) [17];
  size_t FileSize;
  undefined1 local_38 [8];
  string msg;
  IDataBlob *pData_local;
  StandardFile *this_local;
  
  msg.field_2._8_8_ = pData;
  if (pData == (IDataBlob *)0x0) {
    FormatString<char[26],char[17]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcd08d5,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Read",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/StandardFile.cpp"
               ,0x3d);
    std::__cxx11::string::~string((string *)local_38);
  }
  sVar2 = GetSize(this);
  (**(code **)(*(long *)msg.field_2._8_8_ + 0x20))(msg.field_2._8_8_,sVar2);
  Data = (void *)(**(code **)(*(long *)msg.field_2._8_8_ + 0x30))(msg.field_2._8_8_,0);
  sVar2 = (**(code **)(*(long *)msg.field_2._8_8_ + 0x28))();
  bVar1 = Read(this,Data,sVar2);
  return bVar1;
}

Assistant:

bool StandardFile::Read(IDataBlob* pData)
{
    VERIFY_EXPR(pData != nullptr);
    auto FileSize = GetSize();
    pData->Resize(FileSize);
    return Read(pData->GetDataPtr(), pData->GetSize());
}